

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocation __thiscall
soul::SourceCodeUtilities::findStartOfPrecedingComment
          (SourceCodeUtilities *this,CodeLocation *location)

{
  SourceCodeUtilities *this_00;
  byte bVar1;
  SourceCodeText *o;
  UnicodeChar UVar2;
  size_type *psVar3;
  long lVar4;
  ulong *puVar5;
  ulong uVar6;
  UTF8Reader extraout_RDX;
  UTF8Reader UVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  CodeLocation CVar14;
  CodeLocation prevLineStart;
  CodeLocation next;
  string prevLine;
  UTF8Reader temp;
  UTF8Reader local_130;
  ulong local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  CodeLocation local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  ulong local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_e0;
  byte *local_c0;
  CodeLocation local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ulong local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  CodeLocation *local_48;
  SourceCodeText *local_40;
  UTF8Reader local_38;
  
  CodeLocation::getStartOfPreviousLine(&local_110);
  if ((local_110.sourceCode.object == (SourceCodeText *)0x0) ||
     (((local_110.sourceCode.object)->content)._M_string_length == 0)) {
    *(SourceCodeText **)this = (location->sourceCode).object;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    *(char **)(this + 8) = (location->location).data;
    goto LAB_001b5fac;
  }
  CodeLocation::getSourceLine_abi_cxx11_(&local_88,&local_110);
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  if (local_60 == 0) {
LAB_001b5991:
    local_130.data = (char *)&local_120;
    puVar5 = &local_128;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_130.data;
  }
  else {
    if (((byte)local_68->_M_local_buf[0] - 9 < 5) || (local_68->_M_local_buf[0] == 0x20)) {
      if (local_60 != 1) {
        lVar4 = local_60 - 1;
        paVar9 = local_68;
        do {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar9->_M_local_buf + 1);
          if ((4 < (byte)paVar9->_M_local_buf[0] - 9) && (paVar9->_M_local_buf[0] != 0x20)) {
            local_130.data = (char *)&local_120;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((string *)&local_130,paVar9,local_68->_M_local_buf + local_60);
            goto LAB_001b59a9;
          }
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      goto LAB_001b5991;
    }
    local_130.data = (char *)&local_120;
    if (local_68 == &local_58) {
      local_120._8_8_ = local_58._8_8_;
    }
    else {
      local_130.data = (char *)local_68;
    }
    local_120._M_allocated_capacity = local_58._M_allocated_capacity;
    puVar5 = &local_60;
    paVar9 = &local_58;
    local_128 = local_60;
    local_68 = &local_58;
  }
  *puVar5 = 0;
  paVar9->_M_local_buf[0] = 0;
LAB_001b59a9:
  if (local_128 < 2) {
    bVar13 = false;
  }
  else {
    bVar13 = *(short *)local_130.data == 0x2f2f;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.data != &local_120) {
    operator_delete(local_130.data,local_120._M_allocated_capacity + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58._M_allocated_capacity + 1);
  }
  if (bVar13) {
    *(SourceCodeText **)this = local_110.sourceCode.object;
    if (local_110.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_110.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_110.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    *(char **)(this + 8) = local_110.location.data;
    bVar13 = false;
    do {
      CodeLocation::getStartOfPreviousLine(&local_b8);
      bVar12 = true;
      bVar11 = true;
      if (local_b8.sourceCode.object != (SourceCodeText *)0x0) {
        bVar11 = ((local_b8.sourceCode.object)->content)._M_string_length == 0;
      }
      if (!bVar11) {
        CodeLocation::getSourceLine_abi_cxx11_(&local_e0,&local_b8);
        local_130.data = (char *)&local_120;
        if (local_e0._M_string_length == 0) {
LAB_001b5aa4:
          psVar3 = &local_128;
          paVar9 = &local_120;
        }
        else {
          if (((byte)*local_e0._M_dataplus._M_p - 9 < 5) || (*local_e0._M_dataplus._M_p == 0x20)) {
            if (local_e0._M_string_length != 1) {
              lVar4 = local_e0._M_string_length - 1;
              _Var8._M_p = local_e0._M_dataplus._M_p;
              do {
                _Var8._M_p = _Var8._M_p + 1;
                if ((4 < (byte)*_Var8._M_p - 9) && (*_Var8._M_p != 0x20)) {
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            ((string *)&local_130,_Var8._M_p,
                             local_e0._M_dataplus._M_p + local_e0._M_string_length);
                  goto LAB_001b5abb;
                }
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
            goto LAB_001b5aa4;
          }
          paVar9 = &local_e0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p == paVar9) {
            local_120._8_8_ = local_e0.field_2._8_8_;
          }
          else {
            local_130.data = local_e0._M_dataplus._M_p;
          }
          local_120._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
          psVar3 = &local_e0._M_string_length;
          local_128 = local_e0._M_string_length;
          local_e0._M_dataplus._M_p = (pointer)paVar9;
        }
        *psVar3 = 0;
        paVar9->_M_local_buf[0] = 0;
LAB_001b5abb:
        if (1 < local_128) {
          bVar12 = *(short *)local_130.data != 0x2f2f;
        }
      }
      if (!bVar11) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.data != &local_120) {
          operator_delete(local_130.data,local_120._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      bVar11 = true;
      if (!bVar12) {
        if (local_b8.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_b8.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_b8.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        o = *(SourceCodeText **)this;
        *(SourceCodeText **)this = local_b8.sourceCode.object;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
        *(char **)(this + 8) = local_b8.location.data;
        bVar11 = bVar13;
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b8.sourceCode.object);
      bVar13 = bVar11;
    } while (!bVar12);
    if (!bVar11) {
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(*(SourceCodeText **)this);
    }
  }
  else {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if (local_a0 != 0) {
      puVar5 = &local_a0;
      uVar6 = local_a0;
      do {
        if ((4 < (byte)local_a8->_M_local_buf[uVar6 - 1] - 9) &&
           (local_a8->_M_local_buf[uVar6 - 1] != 0x20)) {
          local_a8->_M_local_buf[uVar6] = 0;
          if (local_a8 == &local_98) {
            local_120._8_8_ = local_98._8_8_;
            local_130.data = (char *)&local_120;
          }
          else {
            local_130.data = (char *)local_a8;
          }
          local_120._M_allocated_capacity = local_98._M_allocated_capacity;
          paVar9 = &local_98;
          local_128 = uVar6;
          local_a8 = &local_98;
          local_a0 = uVar6;
          goto LAB_001b5c97;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    local_130.data = (char *)&local_120;
    puVar5 = &local_128;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_130.data;
LAB_001b5c97:
    *puVar5 = 0;
    paVar9->_M_local_buf[0] = 0;
    if (local_128 < 2) {
      bVar13 = false;
    }
    else {
      bVar13 = *(short *)(local_130.data + (local_128 - 2)) == 0x2f2a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.data != &local_120) {
      operator_delete(local_130.data,local_120._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98._M_allocated_capacity + 1);
    }
    if (bVar13) {
      if (local_110.sourceCode.object == (SourceCodeText *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      local_c0 = (byte *)((local_110.sourceCode.object)->utf8).data;
      *(SourceCodeText **)this = local_110.sourceCode.object;
      ((local_110.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_110.sourceCode.object)->super_RefCountedObject).refCount + 1;
      *(char **)(this + 8) = local_110.location.data;
      local_100 = &local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      this_00 = this + 8;
      if (local_f8 != 0) {
        puVar5 = &local_f8;
        uVar6 = local_f8;
        do {
          if ((4 < (byte)local_100->_M_local_buf[uVar6 - 1] - 9) &&
             (local_100->_M_local_buf[uVar6 - 1] != 0x20)) {
            local_100->_M_local_buf[uVar6] = 0;
            if (local_100 == &local_f0) {
              local_120._8_8_ = local_f0._8_8_;
              local_130.data = (char *)&local_120;
            }
            else {
              local_130.data = (char *)local_100;
            }
            local_120._M_allocated_capacity = local_f0._M_allocated_capacity;
            paVar9 = &local_f0;
            local_128 = uVar6;
            local_100 = &local_f0;
            local_f8 = uVar6;
            goto LAB_001b5dee;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      puVar5 = &local_128;
      paVar9 = &local_120;
      local_130.data = (char *)&local_120;
LAB_001b5dee:
      *puVar5 = 0;
      paVar9->_M_local_buf[0] = 0;
      UTF8Reader::operator+=((UTF8Reader *)this_00,(int)local_128 + -2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.data != &local_120) {
        operator_delete(local_130.data,local_120._M_allocated_capacity + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0._M_allocated_capacity + 1);
      }
      local_38.data = (char *)local_c0;
      UTF8Reader::operator++(&local_38);
      UVar7.data = *(char **)this_00;
      bVar13 = false;
      if (local_38.data < UVar7.data) {
        *(char **)this_00 = UVar7.data + -1;
        bVar13 = false;
        *(char **)this_00 = UVar7.data + -2;
        UVar7.data = *(char **)this_00;
        local_48 = location;
        local_40 = (SourceCodeText *)this;
        while( true ) {
          pcVar10 = "/*";
          local_130.data = UVar7.data;
          do {
            bVar1 = *pcVar10;
            if (bVar1 == 0) {
              bVar11 = false;
              bVar13 = true;
            }
            else {
              UVar2 = UTF8Reader::getAndAdvance(&local_130);
              bVar11 = UVar2 == bVar1;
              bVar13 = (bool)(bVar13 & bVar11);
            }
            pcVar10 = (char *)((byte *)pcVar10 + 1);
          } while (bVar11);
          if (UVar7.data <= local_c0 || bVar13) break;
          UVar7.data = UVar7.data + -1;
          *(char **)this_00 = UVar7.data;
        }
        bVar11 = (bool)(bVar13 ^ 1);
        this = (SourceCodeUtilities *)local_40;
        location = local_48;
      }
      else {
        bVar11 = true;
      }
      if (!bVar13) {
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(*(SourceCodeText **)this);
      }
      if (!bVar11) goto LAB_001b5f8b;
    }
    *(SourceCodeText **)this = (location->sourceCode).object;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    (((SourceCodeText *)this)->filename)._M_dataplus._M_p = (location->location).data;
  }
LAB_001b5f8b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_001b5fac:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_110.sourceCode.object);
  CVar14.location.data = extraout_RDX.data;
  CVar14.sourceCode.object = (SourceCodeText *)this;
  return CVar14;
}

Assistant:

CodeLocation SourceCodeUtilities::findStartOfPrecedingComment (CodeLocation location)
{
    auto prevLineStart = location.getStartOfPreviousLine();

    if (prevLineStart.isEmpty())
        return location;

    auto prevLine = prevLineStart.getSourceLine();

    if (choc::text::startsWith (choc::text::trimStart (prevLine), "//"))
    {
        for (auto start = prevLineStart;;)
        {
            auto next = start.getStartOfPreviousLine();

            if (next.isEmpty() || ! choc::text::startsWith (choc::text::trimStart (next.getSourceLine()), "//"))
                return start;

            start = next;
        }
    }

    if (choc::text::endsWith (choc::text::trimEnd (prevLine), "*/"))
    {
        auto fileStart = prevLineStart.sourceCode->utf8;
        auto start = prevLineStart;
        start.location += static_cast<int> (choc::text::trimEnd (prevLine).length() - 2);

        if (start.location > fileStart + 1)
        {
            --(start.location);
            --(start.location);

            for (;;)
            {
                if (start.location.startsWith ("/*"))
                    return start;

                if (start.location > fileStart)
                    --(start.location);
                else
                    break;
            }
        }
    }

    return location;
}